

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O2

int i2r_certpol(X509V3_EXT_METHOD *method,void *ext,BIO *out,int indent)

{
  uint uVar1;
  uint uVar2;
  OPENSSL_STACK *sk;
  undefined8 *puVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  undefined8 *puVar8;
  ASN1_INTEGER *aint;
  undefined4 in_register_0000000c;
  char *pcVar9;
  undefined8 uVar10;
  size_t i_1;
  ulong i_00;
  size_t i;
  ulong i_01;
  ulong i_02;
  
  uVar5 = indent + 4;
  i_02 = 0;
  do {
    sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)ext);
    if (sVar7 <= i_02) {
      return 1;
    }
    puVar8 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)ext,i_02);
    BIO_printf((BIO *)out,"%*sPolicy: ",CONCAT44(in_register_0000000c,indent),"");
    i2a_ASN1_OBJECT((BIO *)out,(ASN1_OBJECT *)*puVar8);
    BIO_puts((BIO *)out,"\n");
    sk = (OPENSSL_STACK *)puVar8[1];
    if (sk != (OPENSSL_STACK *)0x0) {
      i_01 = 0;
      while( true ) {
        sVar7 = OPENSSL_sk_num(sk);
        if (sVar7 <= i_01) break;
        puVar8 = (undefined8 *)OPENSSL_sk_value(sk,i_01);
        iVar6 = OBJ_obj2nid((ASN1_OBJECT *)*puVar8);
        if (iVar6 == 0xa5) {
          BIO_printf((BIO *)out,"%*sUser Notice:\n",(ulong)(indent + 2U),"");
          puVar8 = (undefined8 *)puVar8[1];
          puVar3 = (undefined8 *)*puVar8;
          if (puVar3 != (undefined8 *)0x0) {
            BIO_printf((BIO *)out,"%*sOrganization: %.*s\n",(ulong)uVar5,"",(ulong)*(uint *)*puVar3,
                       *(undefined8 *)((uint *)*puVar3 + 2));
            sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)puVar3[1]);
            pcVar9 = "";
            if (1 < sVar7) {
              pcVar9 = "s";
            }
            BIO_printf((BIO *)out,"%*sNumber%s: ",(ulong)uVar5,"",pcVar9);
            i_00 = 0;
            while( true ) {
              sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)puVar3[1]);
              if (sVar7 <= i_00) break;
              aint = (ASN1_INTEGER *)OPENSSL_sk_value((OPENSSL_STACK *)puVar3[1],i_00);
              if (i_00 != 0) {
                BIO_puts((BIO *)out,", ");
              }
              if (aint == (ASN1_INTEGER *)0x0) {
                BIO_puts((BIO *)out,"(null)");
              }
              else {
                pcVar9 = i2s_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,aint);
                if (pcVar9 == (char *)0x0) goto LAB_00201818;
                BIO_puts((BIO *)out,pcVar9);
                OPENSSL_free(pcVar9);
              }
              i_00 = i_00 + 1;
            }
            BIO_puts((BIO *)out,"\n");
          }
          puVar4 = (uint *)puVar8[1];
          if (puVar4 != (uint *)0x0) {
            uVar1 = *puVar4;
            uVar10 = *(undefined8 *)(puVar4 + 2);
            pcVar9 = "%*sExplicit Text: %.*s\n";
            uVar2 = uVar5;
            goto LAB_0020180a;
          }
        }
        else if (iVar6 == 0xa4) {
          uVar1 = *(uint *)puVar8[1];
          uVar10 = *(undefined8 *)((uint *)puVar8[1] + 2);
          pcVar9 = "%*sCPS: %.*s\n";
          uVar2 = indent + 2U;
LAB_0020180a:
          BIO_printf((BIO *)out,pcVar9,(ulong)uVar2,"",(ulong)uVar1,uVar10);
        }
        else {
          BIO_printf((BIO *)out,"%*sUnknown Qualifier: ",(ulong)uVar5,"");
          i2a_ASN1_OBJECT((BIO *)out,(ASN1_OBJECT *)*puVar8);
          BIO_puts((BIO *)out,"\n");
        }
LAB_00201818:
        i_01 = i_01 + 1;
      }
    }
    i_02 = i_02 + 1;
  } while( true );
}

Assistant:

static int i2r_certpol(const X509V3_EXT_METHOD *method, void *ext, BIO *out,
                       int indent) {
  const STACK_OF(POLICYINFO) *pol =
      reinterpret_cast<const STACK_OF(POLICYINFO) *>(ext);
  // First print out the policy OIDs
  for (size_t i = 0; i < sk_POLICYINFO_num(pol); i++) {
    const POLICYINFO *pinfo = sk_POLICYINFO_value(pol, i);
    BIO_printf(out, "%*sPolicy: ", indent, "");
    i2a_ASN1_OBJECT(out, pinfo->policyid);
    BIO_puts(out, "\n");
    if (pinfo->qualifiers) {
      print_qualifiers(out, pinfo->qualifiers, indent + 2);
    }
  }
  return 1;
}